

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          VWReaderHandler<true> *handler,bool isKey)

{
  bool bVar1;
  Ch CVar2;
  undefined1 uVar3;
  bool bVar4;
  Ch *begin;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_00;
  byte in_CL;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_RSI;
  Ch *str;
  size_t length;
  Ch *head;
  bool success;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *s;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> copy;
  size_t offset;
  uint codepoint2;
  uint codepoint;
  Ch e;
  size_t escapeOffset;
  Ch c;
  ParseErrorCode in_stack_fffffffffffffeac;
  ParseErrorCode code;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffeb0;
  SizeType len;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>
  *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  bool local_12e;
  bool local_126;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> local_c8;
  byte local_a1;
  size_t local_88;
  uint local_7c;
  uint local_78;
  byte local_71;
  size_t local_70;
  byte local_61;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> *local_60;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> *local_58;
  char local_41;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> *local_40;
  undefined1 local_32;
  char local_31;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> *local_30;
  undefined1 local_21;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> *local_20;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> *local_18;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> *local_10;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> *local_8;
  
  local_a1 = in_CL & 1;
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy(&local_c8,in_RSI);
  GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_c8.s);
  begin = GenericInsituStringStream<rapidjson::UTF8<char>_>::PutBegin(&local_c8.s);
  local_60 = &local_c8;
  local_58 = &local_c8;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          local_18 = local_58;
          local_20 = local_60;
          local_61 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(&local_58->s);
          if (local_61 == 0x5c) break;
          if (local_61 == 0x22) {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_58->s);
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Put(&local_60->s,'\0');
            goto LAB_00274505;
          }
          if (local_61 < 0x20) {
            if (local_61 == 0) {
              GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(&local_58->s);
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,0x2743fb);
              in_stack_fffffffffffffecf =
                   GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                    *)0x274405);
              if ((bool)in_stack_fffffffffffffecf) goto LAB_00274505;
            }
            else {
              GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(&local_58->s);
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,0x27443b);
              in_stack_fffffffffffffece =
                   GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                    *)0x274445);
              if ((bool)in_stack_fffffffffffffece) goto LAB_00274505;
            }
          }
          else {
            local_88 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(&local_58->s);
            local_8 = local_58;
            local_10 = local_60;
            in_stack_fffffffffffffec0 = local_60;
            CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_58->s);
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Put
                      (&in_stack_fffffffffffffec0->s,CVar2);
          }
        }
        local_70 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(&local_58->s);
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_58->s);
        local_71 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(&local_58->s);
        if (ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&)
            ::escape[local_71] == '\0') break;
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_58->s);
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Put
                  (&local_60->s,
                   ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&)
                   ::escape[local_71]);
      }
      if (local_71 != 0x75) break;
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_58->s);
      local_78 = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                           ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)CONCAT17(in_stack_fffffffffffffecf,
                                        CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8
                                                )),&in_stack_fffffffffffffec0->s,
                            CONCAT17(in_stack_fffffffffffffebf,
                                     CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)))
      ;
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x2740f7);
      if (bVar4) goto LAB_00274505;
      local_126 = 0xd7ff < local_78 && local_78 < 0xdc00;
      if (local_126) {
        local_30 = local_58;
        local_31 = '\\';
        CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(&local_58->s);
        bVar4 = CVar2 == local_31;
        if (bVar4) {
          GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_30->s);
        }
        bVar1 = true;
        local_21 = bVar4;
        if (bVar4) {
          local_40 = local_58;
          local_41 = 'u';
          CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(&local_58->s);
          bVar4 = CVar2 == local_41;
          if (bVar4) {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(&local_40->s);
          }
          bVar1 = !bVar4;
          local_32 = bVar4;
        }
        if (bVar1) {
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,0x274232);
          bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x27423c);
          if (bVar4) goto LAB_00274505;
        }
        local_7c = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                             ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                               *)CONCAT17(in_stack_fffffffffffffecf,
                                          CONCAT16(in_stack_fffffffffffffece,
                                                   in_stack_fffffffffffffec8)),
                              &in_stack_fffffffffffffec0->s,
                              CONCAT17(in_stack_fffffffffffffebf,
                                       CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)
                                      ));
        bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x274288);
        if (bVar4) goto LAB_00274505;
        local_12e = local_7c < 0xdc00 || 0xdfff < local_7c;
        if (local_12e) {
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,0x2742e3);
          bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x2742ed);
          if (bVar4) goto LAB_00274505;
        }
        local_78 = ((local_78 - 0xd800) * 0x400 | local_7c - 0xdc00) + 0x10000;
      }
      UTF8<char>::Encode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)in_stack_fffffffffffffeb0,
                 in_stack_fffffffffffffeac);
    }
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,0x27435b);
    bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x274365);
  } while (!bVar4);
LAB_00274505:
  uVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x274513);
  if (!(bool)uVar3) {
    this_00 = (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
               *)GenericInsituStringStream<rapidjson::UTF8<char>_>::PutEnd(&local_c8.s,begin);
    bVar4 = SUB81((ulong)this_00 >> 0x18,0);
    len = (SizeType)((ulong)this_00 >> 0x20);
    if ((local_a1 & 1) == 0) {
      bVar4 = VWReaderHandler<true>::String
                        ((VWReaderHandler<true> *)in_stack_fffffffffffffec0,
                         (char *)CONCAT17(in_stack_fffffffffffffebf,
                                          CONCAT16(uVar3,in_stack_fffffffffffffeb8)),len,bVar4);
      code = CONCAT13((char)(in_stack_fffffffffffffeac >> 0x18),
                      CONCAT12(bVar4,CONCAT11(bVar4,(char)in_stack_fffffffffffffeac)));
    }
    else {
      bVar4 = VWReaderHandler<true>::Key
                        ((VWReaderHandler<true> *)in_stack_fffffffffffffec0,
                         (char *)CONCAT17(in_stack_fffffffffffffebf,
                                          CONCAT16(uVar3,in_stack_fffffffffffffeb8)),len,bVar4);
      code = CONCAT13(bVar4,CONCAT12(bVar4,(short)in_stack_fffffffffffffeac));
    }
    if ((((byte)(code >> 0x10) ^ 0xff) & 1) != 0) {
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(&local_c8.s);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError(this_00,code,0x274626);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)0x274634);
    }
  }
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy(&local_c8);
  return;
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false)
  { internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    RAPIDJSON_ASSERT(s.Peek() == '\"');
    s.Take();  // Skip '\"'

    bool success = false;
    if (parseFlags & kParseInsituFlag)
    { typename InputStream::Ch *head = s.PutBegin();
      ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
      size_t length = s.PutEnd(head) - 1;
      RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
      const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
      success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
    }
    else
    { StackStream<typename TargetEncoding::Ch> stackStream(stack_);
      ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
      SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
      const typename TargetEncoding::Ch* const str = stackStream.Pop();
      success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
    }
    if (RAPIDJSON_UNLIKELY(!success))
      RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
  }